

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegionFileFormat.cpp
# Opt level: O3

void __thiscall
RegionFileFormat::saveRegion
          (RegionFileFormat *this,Board *board,RegionCoords *regionCoords,Region *region)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  path *ppVar5;
  source_loc loc;
  source_loc loc_00;
  source_loc loc_01;
  source_loc loc_02;
  source_loc loc_03;
  source_loc loc_04;
  uint uVar6;
  char cVar7;
  long *plVar8;
  undefined8 *puVar9;
  path *ppVar10;
  logger *plVar11;
  _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Chunk>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var12;
  const_iterator cVar13;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar14;
  _Base_ptr p_Var15;
  pointer pcVar16;
  _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
  *this_00;
  pair<int,_int> __first;
  _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
  *this_01;
  _Rb_tree_node_base *p_Var17;
  runtime_error *prVar18;
  uint uVar19;
  uint uVar20;
  ulong *puVar21;
  size_type *psVar22;
  size_type sVar23;
  ulong uVar24;
  path *ppVar25;
  int iVar26;
  _Rb_tree_header *p_Var27;
  uint uVar28;
  pointer pcVar29;
  path *ppVar30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  uint uVar31;
  string_view_t fmt;
  string_view_t fmt_00;
  string_view_t fmt_01;
  string_view_t fmt_02;
  string_view_t fmt_03;
  string_view_t fmt_04;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>,_bool>
  pVar32;
  pair<std::_Rb_tree_iterator<unsigned_long>,_std::_Rb_tree_iterator<unsigned_long>_> pVar33;
  string __str_1;
  streamsize regionFileLength;
  map<unsigned_long,_std::vector<char,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>
  serializedChunks;
  uint32_t currentSectors;
  uint32_t sectorCount;
  uint32_t lastOffset;
  path regionFilename;
  char emptySector [256];
  fstream regionFile;
  ChunkHeader header [1024];
  string local_14a8;
  size_type local_1480;
  uint local_1474;
  RegionCoords *local_1470;
  undefined1 local_1468 [32];
  _Rb_tree_node_base *local_1448;
  size_t local_1440;
  RegionFileFormat *local_1438;
  Board *local_1430;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1428;
  _Alloc_hider local_1408;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_13e8;
  path local_13c8;
  string local_13a8;
  undefined1 local_1388 [16];
  _Rb_tree_header local_1378 [6];
  string local_1288;
  string local_1268;
  undefined1 local_1248 [16];
  undefined1 local_1238 [248];
  undefined8 local_1140 [33];
  string_type local_1038 [128];
  
  uVar28 = regionCoords->first;
  uVar20 = -uVar28;
  if (0 < (int)uVar28) {
    uVar20 = uVar28;
  }
  uVar31 = 1;
  if (9 < uVar20) {
    uVar24 = (ulong)uVar20;
    uVar6 = 4;
    do {
      uVar31 = uVar6;
      uVar19 = (uint)uVar24;
      if (uVar19 < 100) {
        uVar31 = uVar31 - 2;
        goto LAB_0016dd6a;
      }
      if (uVar19 < 1000) {
        uVar31 = uVar31 - 1;
        goto LAB_0016dd6a;
      }
      if (uVar19 < 10000) goto LAB_0016dd6a;
      uVar24 = uVar24 / 10000;
      uVar6 = uVar31 + 4;
    } while (99999 < uVar19);
    uVar31 = uVar31 + 1;
  }
LAB_0016dd6a:
  local_1468._0_8_ = local_1468 + 0x10;
  local_1470 = regionCoords;
  local_1438 = this;
  local_1430 = board;
  std::__cxx11::string::_M_construct((ulong)local_1468,(char)uVar31 - (char)((int)uVar28 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_1468._0_8_ + (ulong)(uVar28 >> 0x1f)),uVar31,uVar20);
  plVar8 = (long *)std::__cxx11::string::append(local_1468);
  p_Var27 = (_Rb_tree_header *)(local_1388 + 0x10);
  puVar21 = (ulong *)(plVar8 + 2);
  if ((_Rb_tree_header *)*plVar8 == (_Rb_tree_header *)puVar21) {
    local_1378[0]._M_header._0_8_ = *puVar21;
    local_1378[0]._M_header._M_parent = (_Base_ptr)plVar8[3];
    local_1388._0_8_ = p_Var27;
  }
  else {
    local_1378[0]._M_header._0_8_ = *puVar21;
    local_1388._0_8_ = (_Rb_tree_header *)*plVar8;
  }
  local_1388._8_8_ = plVar8[1];
  *plVar8 = (long)puVar21;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  uVar28 = local_1470->second;
  uVar20 = -uVar28;
  if (0 < (int)uVar28) {
    uVar20 = uVar28;
  }
  uVar31 = 1;
  if (9 < uVar20) {
    uVar24 = (ulong)uVar20;
    uVar6 = 4;
    do {
      uVar31 = uVar6;
      uVar19 = (uint)uVar24;
      if (uVar19 < 100) {
        uVar31 = uVar31 - 2;
        goto LAB_0016de63;
      }
      if (uVar19 < 1000) {
        uVar31 = uVar31 - 1;
        goto LAB_0016de63;
      }
      if (uVar19 < 10000) goto LAB_0016de63;
      uVar24 = uVar24 / 10000;
      uVar6 = uVar31 + 4;
    } while (99999 < uVar19);
    uVar31 = uVar31 + 1;
  }
LAB_0016de63:
  local_14a8._M_dataplus._M_p = (pointer)&local_14a8.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_14a8,(char)uVar31 - (char)((int)uVar28 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_14a8._M_dataplus._M_p + (uVar28 >> 0x1f),uVar31,uVar20);
  pcVar1 = (pointer)((long)(_Rb_tree_color *)local_1388._8_8_ + local_14a8._M_string_length);
  pcVar29 = (pointer)0xf;
  if ((_Rb_tree_header *)local_1388._0_8_ != p_Var27) {
    pcVar29 = (pointer)local_1378[0]._M_header._0_8_;
  }
  if (pcVar29 < pcVar1) {
    uVar14 = (pointer)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_14a8._M_dataplus._M_p != &local_14a8.field_2) {
      uVar14 = local_14a8.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar14 < pcVar1) goto LAB_0016dee8;
    puVar9 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_14a8,0,(char *)0x0,local_1388._0_8_);
  }
  else {
LAB_0016dee8:
    puVar9 = (undefined8 *)
             std::__cxx11::string::_M_append(local_1388,(ulong)local_14a8._M_dataplus._M_p);
  }
  local_1248._0_8_ = local_1238;
  psVar22 = puVar9 + 2;
  if ((size_type *)*puVar9 == psVar22) {
    local_1238._0_8_ = *psVar22;
    local_1238._8_8_ = puVar9[3];
  }
  else {
    local_1238._0_8_ = *psVar22;
    local_1248._0_8_ = (size_type *)*puVar9;
  }
  local_1248._8_8_ = puVar9[1];
  *puVar9 = psVar22;
  puVar9[1] = 0;
  *(char *)psVar22 = '\0';
  plVar8 = (long *)std::__cxx11::string::append(local_1248);
  paVar2 = &local_1038[0].field_2;
  psVar22 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar22) {
    local_1038[0].field_2._0_8_ = *psVar22;
    local_1038[0].field_2._8_8_ = plVar8[3];
    local_1038[0]._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_1038[0].field_2._0_8_ = *psVar22;
    local_1038[0]._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_1038[0]._M_string_length = plVar8[1];
  *plVar8 = (long)psVar22;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  ghc::filesystem::path::path(&local_13c8,local_1038,auto_format);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1038[0]._M_dataplus._M_p);
  }
  if ((undefined1 *)local_1248._0_8_ != local_1238) {
    operator_delete((void *)local_1248._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_14a8._M_dataplus._M_p != &local_14a8.field_2) {
    operator_delete(local_14a8._M_dataplus._M_p);
  }
  if ((_Rb_tree_header *)local_1388._0_8_ != p_Var27) {
    operator_delete((void *)local_1388._0_8_);
  }
  if ((undefined1 *)local_1468._0_8_ != local_1468 + 0x10) {
    operator_delete((void *)local_1468._0_8_);
  }
  ppVar10 = FileStorage::getFilename(&local_1438->super_FileStorage);
  local_1038[0]._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1038,"region","");
  local_1468._0_8_ = local_1468 + 0x10;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)local_1468,local_1038[0]._M_dataplus._M_p,
             local_1038[0]._M_dataplus._M_p + local_1038[0]._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1038[0]._M_dataplus._M_p != paVar2) {
    operator_delete(local_1038[0]._M_dataplus._M_p);
  }
  ghc::filesystem::path::postprocess_path_with_format((path *)local_1468,auto_format);
  ghc::filesystem::operator/((path *)local_1388,ppVar10,(path *)local_1468);
  ghc::filesystem::operator/((path *)local_1248,(path *)local_1388,&local_13c8);
  ghc::filesystem::path::operator=(&local_13c8,(path *)local_1248);
  ghc::filesystem::path::~path((path *)local_1248);
  ghc::filesystem::path::~path((path *)local_1388);
  ghc::filesystem::path::~path((path *)local_1468);
  ghc::filesystem::basic_fstream<char,_std::char_traits<char>_>::basic_fstream
            ((basic_fstream<char,_std::char_traits<char>_> *)local_1248,&local_13c8,
             _S_out|_S_in|_S_bin);
  plVar11 = spdlog::default_logger_raw();
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1470->second;
  local_1038[0]._M_dataplus._M_p = (pointer)0x0;
  local_1038[0]._M_string_length = 0;
  local_1038[0].field_2._M_allocated_capacity = 0;
  loc.funcname = (char *)0x0;
  loc.filename = (char *)0x0;
  loc.line = 0;
  loc._12_4_ = 0;
  fmt.size_ = 0x20;
  fmt.data_ = "Saving chunks for region {}, {}.";
  spdlog::logger::log_<int_const&,int_const&>
            (plVar11,loc,debug,fmt,&local_1470->first,(int *)args_1);
  memset(local_1038,0,0x1000);
  local_1480 = 0;
  cVar7 = std::__basic_file<char>::is_open();
  if (cVar7 == '\0') {
    ghc::filesystem::basic_fstream<char,_std::char_traits<char>_>::open
              ((basic_fstream<char,_std::char_traits<char>_> *)local_1248,(char *)&local_13c8,0x14);
    cVar7 = std::__basic_file<char>::is_open();
    if (cVar7 == '\0') {
LAB_0016e97b:
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      ghc::filesystem::path::string_abi_cxx11_(&local_14a8,&local_13c8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1468
                     ,"\"",&local_14a8);
      puVar9 = (undefined8 *)std::__cxx11::string::append(local_1468);
      local_1388._0_8_ = *puVar9;
      puVar21 = puVar9 + 2;
      if ((ulong *)local_1388._0_8_ == puVar21) {
        p_Var15 = (_Base_ptr)puVar9[3];
        *(ulong *)&p_Var27->_M_header = *puVar21;
        (p_Var27->_M_header)._M_parent = p_Var15;
        local_1388._0_8_ = p_Var27;
      }
      else {
        local_1378[0]._M_header._0_8_ = *puVar21;
      }
      local_1388._8_8_ = puVar9[1];
      *puVar9 = puVar21;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      std::runtime_error::runtime_error(prVar18,(string *)local_1388);
      __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  else {
    std::istream::ignore((long)local_1248);
    local_1480 = local_1248._8_8_;
    std::ios::clear((int)local_1248 + (int)*(undefined8 *)(local_1248._0_8_ + -0x18));
    std::istream::seekg((long)local_1248,_S_beg);
    if ((long)local_1480 < 0x1000) {
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      ghc::filesystem::path::string_abi_cxx11_(&local_13a8,&local_13c8);
      std::operator+(&local_13e8,"\"",&local_13a8);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_13e8);
      local_1428._M_dataplus._M_p = (pointer)*plVar8;
      psVar22 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_1428._M_dataplus._M_p == psVar22) {
        local_1428.field_2._M_allocated_capacity = *psVar22;
        local_1428.field_2._8_8_ = plVar8[3];
        local_1428._M_dataplus._M_p = (pointer)&local_1428.field_2;
      }
      else {
        local_1428.field_2._M_allocated_capacity = *psVar22;
      }
      local_1428._M_string_length = plVar8[1];
      *plVar8 = (long)psVar22;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::to_string(&local_1268,local_1480);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_1408,&local_1428,&local_1268);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_1408);
      local_14a8._M_dataplus._M_p = (pointer)*plVar8;
      psVar22 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_14a8._M_dataplus._M_p == psVar22) {
        local_14a8.field_2._M_allocated_capacity = *psVar22;
        local_14a8.field_2._8_8_ = plVar8[3];
        local_14a8._M_dataplus._M_p = (pointer)&local_14a8.field_2;
      }
      else {
        local_14a8.field_2._M_allocated_capacity = *psVar22;
      }
      local_14a8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar22;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::to_string(&local_1288,0x1000);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1468
                     ,&local_14a8,&local_1288);
      puVar9 = (undefined8 *)std::__cxx11::string::append(local_1468);
      local_1388._0_8_ = *puVar9;
      psVar22 = puVar9 + 2;
      if ((size_type *)local_1388._0_8_ == psVar22) {
        local_1378[0]._M_header._0_8_ = *psVar22;
        local_1378[0]._M_header._M_parent = (_Base_ptr)puVar9[3];
        local_1388._0_8_ = p_Var27;
      }
      else {
        local_1378[0]._M_header._0_8_ = *psVar22;
      }
      local_1388._8_8_ = puVar9[1];
      *puVar9 = psVar22;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      std::runtime_error::runtime_error(prVar18,(string *)local_1388);
      __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if ((char)local_1480 != '\0') {
      prVar18 = (runtime_error *)__cxa_allocate_exception(0x10);
      ghc::filesystem::path::string_abi_cxx11_(&local_13a8,&local_13c8);
      std::operator+(&local_13e8,"\"",&local_13a8);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_13e8);
      local_1428._M_dataplus._M_p = (pointer)*plVar8;
      psVar22 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_1428._M_dataplus._M_p == psVar22) {
        local_1428.field_2._M_allocated_capacity = *psVar22;
        local_1428.field_2._8_8_ = plVar8[3];
        local_1428._M_dataplus._M_p = (pointer)&local_1428.field_2;
      }
      else {
        local_1428.field_2._M_allocated_capacity = *psVar22;
      }
      local_1428._M_string_length = plVar8[1];
      *plVar8 = (long)psVar22;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::to_string(&local_1268,local_1480);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_1408,&local_1428,&local_1268);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_1408);
      local_14a8._M_dataplus._M_p = (pointer)*plVar8;
      psVar22 = (size_type *)(plVar8 + 2);
      if ((size_type *)local_14a8._M_dataplus._M_p == psVar22) {
        local_14a8.field_2._M_allocated_capacity = *psVar22;
        local_14a8.field_2._8_8_ = plVar8[3];
        local_14a8._M_dataplus._M_p = (pointer)&local_14a8.field_2;
      }
      else {
        local_14a8.field_2._M_allocated_capacity = *psVar22;
      }
      local_14a8._M_string_length = plVar8[1];
      *plVar8 = (long)psVar22;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::to_string(&local_1288,0x100);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1468
                     ,&local_14a8,&local_1288);
      puVar9 = (undefined8 *)std::__cxx11::string::append(local_1468);
      local_1388._0_8_ = *puVar9;
      psVar22 = puVar9 + 2;
      if ((size_type *)local_1388._0_8_ == psVar22) {
        local_1378[0]._M_header._0_8_ = *psVar22;
        local_1378[0]._M_header._M_parent = (_Base_ptr)puVar9[3];
        local_1388._0_8_ = p_Var27;
      }
      else {
        local_1378[0]._M_header._0_8_ = *psVar22;
      }
      local_1388._8_8_ = puVar9[1];
      *puVar9 = psVar22;
      puVar9[1] = 0;
      *(undefined1 *)(puVar9 + 2) = 0;
      std::runtime_error::runtime_error(prVar18,(string *)local_1388);
      __cxa_throw(prVar18,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    plVar11 = spdlog::default_logger_raw();
    local_1388._0_8_ = (_Rb_tree_header *)0x0;
    local_1388._8_8_ = (_Base_ptr)0x0;
    local_1378[0]._M_header._0_8_ = 0;
    ppVar10 = (path *)0x1;
    loc_00.funcname = (char *)0x0;
    loc_00.filename = (char *)0x0;
    loc_00.line = 0;
    loc_00._12_4_ = 0;
    fmt_00.size_ = 0x29;
    fmt_00.data_ = "Found existing region file with {} bytes.";
    spdlog::logger::log_<long&>(plVar11,loc_00,debug,fmt_00,(long *)&local_1480);
    readRegionHeader((ChunkHeader *)local_1038,ppVar10,(istream *)local_1248);
  }
  std::ostream::seekp((long)local_1238,_S_beg);
  local_1468._24_8_ = local_1468 + 8;
  local_1468._8_4_ = _S_red;
  local_1468._16_8_ = (path *)0x0;
  local_1440 = 0;
  p_Var15 = (region->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var27 = &(region->_M_t)._M_impl.super__Rb_tree_header;
  local_1448 = (_Rb_tree_node_base *)local_1468._24_8_;
  if ((_Rb_tree_header *)p_Var15 == p_Var27) {
    __first.first = 0;
    __first.second = 0;
    memset(local_1388,0,0x100);
  }
  else {
    local_1474 = 0;
    do {
      p_Var12 = &Board::getLoadedChunks(local_1430)->_M_h;
      p_Var17 = p_Var15 + 1;
      cVar13 = std::
               _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Chunk>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::find(p_Var12,(key_type *)p_Var17);
      if (cVar13.super__Node_iterator_base<std::pair<const_unsigned_long,_Chunk>,_false>._M_cur ==
          (__node_type *)0x0) {
        std::__throw_out_of_range(anon_var_dwarf_2b4f2);
        goto LAB_0016e96f;
      }
      Chunk::serialize((vector<char,_std::allocator<char>_> *)local_1388,
                       (Chunk *)((long)cVar13.
                                       super__Node_iterator_base<std::pair<const_unsigned_long,_Chunk>,_false>
                                       ._M_cur + 0x10));
      pVar32 = std::
               _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>>>
               ::_M_emplace_unique<unsigned_long_const&,std::vector<char,std::allocator<char>>>
                         ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>>>
                           *)local_1468,(unsigned_long *)p_Var17,
                          (vector<char,_std::allocator<char>_> *)local_1388);
      if ((_Rb_tree_header *)local_1388._0_8_ != (_Rb_tree_header *)0x0) {
        operator_delete((void *)local_1388._0_8_);
      }
      if (0 < (long)local_1480) {
        uVar24 = *(ulong *)p_Var17;
        p_Var3 = pVar32.first._M_node._M_node[1]._M_parent;
        p_Var4 = pVar32.first._M_node._M_node[1]._M_left;
        uVar20 = ((int)p_Var4 - (int)p_Var3) + 0x103U >> 8;
        local_1408._M_p._0_4_ = uVar20;
        uVar28 = *(uint *)((long)&local_1038[0]._M_dataplus._M_p +
                          (ulong)((uint)uVar24 & 0x1f | (uint)(uVar24 >> 0x1b) & 0x3e0) * 4);
        if (0xffffff < uVar28) {
          if (p_Var3 == p_Var4) {
            local_14a8._M_dataplus._M_p = (pointer)(uVar24 ^ 0x8000000080000000);
            plVar11 = spdlog::default_logger_raw();
            local_1388._0_8_ = (_Rb_tree_header *)0x0;
            local_1388._8_8_ = (_Base_ptr)0x0;
            local_1378[0]._M_header._0_8_ = 0;
            loc_02.funcname = (char *)0x0;
            loc_02.filename = (char *)0x0;
            loc_02.line = 0;
            loc_02._12_4_ = 0;
            fmt_02.size_ = 0x26;
            fmt_02.data_ = "Chunk {} requires 0 sectors, removing.";
            spdlog::logger::log_<std::pair<int,int>>
                      (plVar11,loc_02,debug,fmt_02,(pair<int,_int> *)&local_14a8);
            uVar14 = extraout_RAX_00;
          }
          else {
            uVar28 = uVar28 >> 0x18;
            if (uVar20 <= uVar28) goto LAB_0016e4ae;
            local_1428._M_dataplus._M_p._0_4_ = uVar28;
            local_14a8._M_dataplus._M_p = (pointer)(uVar24 ^ 0x8000000080000000);
            plVar11 = spdlog::default_logger_raw();
            local_1388._0_8_ = (_Rb_tree_header *)0x0;
            local_1388._8_8_ = (_Base_ptr)0x0;
            local_1378[0]._M_header._0_8_ = 0;
            args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &local_1408;
            loc_01.funcname = (char *)0x0;
            loc_01.filename = (char *)0x0;
            loc_01.line = 0;
            loc_01._12_4_ = 0;
            fmt_01.size_ = 0x37;
            fmt_01.data_ = "Chunk {} requires {} sectors but only {} are allocated.";
            spdlog::logger::log_<std::pair<int,int>,unsigned_int_const&,unsigned_int_const&>
                      (plVar11,loc_01,debug,fmt_01,(pair<int,_int> *)&local_14a8,(uint *)args_1,
                       (uint *)&local_1428);
            uVar14 = extraout_RAX;
          }
          local_1474 = (uint)CONCAT71((int7)((ulong)uVar14 >> 8),1);
        }
      }
LAB_0016e4ae:
      p_Var15 = (_Base_ptr)std::_Rb_tree_increment(p_Var15);
    } while ((_Rb_tree_header *)p_Var15 != p_Var27);
    __first.first = 0;
    __first.second = 0;
    memset(local_1388,0,0x100);
    local_13e8._M_dataplus._M_p._0_4_ = 0x10;
    if ((local_1474 & 1) != 0) {
      plVar11 = spdlog::default_logger_raw();
      local_14a8._M_dataplus._M_p = (pointer)0x0;
      local_14a8._M_string_length = 0;
      local_14a8.field_2._M_allocated_capacity = 0;
      __first.first = 1;
      __first.second = 0;
      spdlog::logger::log(plVar11,0.0);
      uVar24 = 0;
      do {
        ppVar10 = (path *)(uVar24 >> 5 & 0x7ffffff);
        local_1408._M_p =
             (pointer)(CONCAT44(local_1470->second * 0x20 + (int)ppVar10,
                                local_1470->first << 5 | (uint)uVar24 & 0x1f) | 0x8000000080000000);
        if (0xffffff < *(uint *)((long)&local_1038[0]._M_dataplus._M_p + uVar24 * 4)) {
          if ((path *)local_1468._16_8_ != (path *)0x0) {
            ppVar5 = (path *)local_1468._16_8_;
            ppVar30 = (path *)(local_1468 + 8);
            do {
              ppVar10 = ppVar30;
              ppVar25 = ppVar5;
              __first = (pair<int,_int>)ppVar25[1]._path._M_dataplus._M_p;
              ppVar30 = ppVar25;
              if ((ulong)__first < local_1408._M_p) {
                ppVar30 = ppVar10;
              }
              ppVar5 = *(path **)((long)&(ppVar25->_path).field_2 +
                                 (ulong)((ulong)__first < local_1408._M_p) * 8);
            } while (ppVar5 != (path *)0x0);
            if (ppVar30 != (path *)(local_1468 + 8)) {
              if ((ulong)__first < local_1408._M_p) {
                ppVar25 = ppVar10;
              }
              if (ppVar25[1]._path._M_dataplus._M_p <= local_1408._M_p) goto LAB_0016e60e;
            }
          }
          readChunk((vector<char,_std::allocator<char>_> *)&local_14a8,(ChunkHeader *)local_1038,
                    (uint)uVar24,ppVar10,(istream *)local_1248);
          __first = (pair<int,_int>)&local_1408;
          std::
          _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>>>
          ::_M_emplace_unique<unsigned_long_const&,std::vector<char,std::allocator<char>>>
                    ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>,std::_Select1st<std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::vector<char,std::allocator<char>>>>>
                      *)local_1468,(unsigned_long *)&local_1408,
                     (vector<char,_std::allocator<char>_> *)&local_14a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_14a8._M_dataplus._M_p !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            operator_delete(local_14a8._M_dataplus._M_p);
          }
        }
LAB_0016e60e:
        *(undefined4 *)((long)&local_1038[0]._M_dataplus._M_p + uVar24 * 4) = 0;
        uVar24 = uVar24 + 1;
      } while (uVar24 != 0x400);
      goto LAB_0016e696;
    }
  }
  local_13e8._M_dataplus._M_p._0_4_ = 0x10;
  if (local_1480 == 0) {
    iVar26 = 0x10;
    do {
      __first = (pair<int,_int>)local_1388;
      std::ostream::write(local_1238,(long)local_1388);
      iVar26 = iVar26 + -1;
    } while (iVar26 != 0);
  }
  else {
    sVar23 = local_1480 + 0xff;
    if (-1 < (long)local_1480) {
      sVar23 = local_1480;
    }
    local_13e8._M_dataplus._M_p._0_4_ = (undefined4)(sVar23 >> 8);
  }
LAB_0016e696:
  if ((_Rb_tree_node_base *)local_1468._24_8_ != (_Rb_tree_node_base *)(local_1468 + 8)) {
    local_1438 = (RegionFileFormat *)&local_1438->savedRegions_;
    p_Var17 = (_Rb_tree_node_base *)local_1468._24_8_;
    do {
      __first = (pair<int,_int>)(p_Var17 + 1);
      pcVar16 = (pointer)((long)p_Var17[1]._M_left - (long)p_Var17[1]._M_parent);
      if (pcVar16 == (pointer)0x0) {
        this_00 = &std::
                   map<std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                   ::operator[]((map<std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                                 *)local_1438,local_1470)->_M_t;
        pVar33 = std::
                 _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                 ::equal_range(this_00,(key_type *)__first);
        __first = (pair<int,_int>)pVar33.first._M_node;
        std::
        _Rb_tree<unsigned_long,_unsigned_long,_std::_Identity<unsigned_long>,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
        ::_M_erase_aux(this_00,(const_iterator)__first,(_Base_ptr)pVar33.second._M_node);
      }
      else {
        p_Var27 = *(_Rb_tree_header **)(p_Var17 + 1);
        if ((int)pcVar16 - 0xfefdU < 0xffff00ff) {
          local_1408._M_p = (pointer)((ulong)p_Var27 ^ 0x8000000080000000);
          local_1428._M_dataplus._M_p = pcVar16;
          plVar11 = spdlog::default_logger_raw();
          local_14a8._M_dataplus._M_p = (pointer)0x0;
          local_14a8._M_string_length = 0;
          local_14a8.field_2._M_allocated_capacity = 0;
          __first.first = 4;
          __first.second = 0;
          args_1 = &local_1428;
          loc_03.funcname = (char *)0x0;
          loc_03.filename = (char *)0x0;
          loc_03.line = 0;
          loc_03._12_4_ = 0;
          fmt_03.size_ = 0x34;
          fmt_03.data_ = "Failed to save chunk at {} (serialized to {} bytes).";
          spdlog::logger::log_<std::pair<int,int>,unsigned_long>
                    (plVar11,loc_03,err,fmt_03,(pair<int,_int> *)&local_1408,(unsigned_long *)args_1
                    );
        }
        else {
          this_01 = (_Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
                     *)std::
                       map<std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                       ::operator[]((map<std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                                     *)local_1438,local_1470);
          std::
          _Rb_tree<unsigned_long,unsigned_long,std::_Identity<unsigned_long>,std::less<unsigned_long>,std::allocator<unsigned_long>>
          ::_M_insert_unique<unsigned_long_const&>(this_01,(unsigned_long *)__first);
          local_1408._M_p = (pointer)(*(ulong *)__first ^ 0x8000000080000000);
          plVar11 = spdlog::default_logger_raw();
          local_14a8._M_dataplus._M_p = (pointer)0x0;
          local_14a8._M_string_length = 0;
          local_14a8.field_2._M_allocated_capacity = 0;
          loc_04.funcname = (char *)0x0;
          loc_04.filename = (char *)0x0;
          loc_04.line = 0;
          loc_04._12_4_ = 0;
          fmt_04.size_ = 0x11;
          fmt_04.data_ = "Writing chunk {}.";
          spdlog::logger::log_<std::pair<int,int>>
                    (plVar11,loc_04,debug,fmt_04,(pair<int,_int> *)&local_1408);
          p_Var12 = &Board::getLoadedChunks(local_1430)->_M_h;
          cVar13 = std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Chunk>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(p_Var12,(key_type *)__first);
          if (cVar13.super__Node_iterator_base<std::pair<const_unsigned_long,_Chunk>,_false>._M_cur
              == (__node_type *)0x0) goto LAB_0016e96f;
          Chunk::debugPrintChunk
                    ((Chunk *)((long)cVar13.
                                     super__Node_iterator_base<std::pair<const_unsigned_long,_Chunk>,_false>
                                     ._M_cur + 0x10));
          p_Var27 = (_Rb_tree_header *)((ulong)p_Var27 & 0x1f0000001f);
          writeChunk((ChunkHeader *)local_1038,(uint)((ulong)p_Var27 >> 0x1b) | (uint)p_Var27,
                     local_1388,(uint32_t *)&local_13e8,
                     (vector<char,_std::allocator<char>_> *)&p_Var17[1]._M_parent,(path *)args_1,
                     (ostream *)local_1238);
          p_Var12 = &Board::getLoadedChunks(local_1430)->_M_h;
          cVar13 = std::
                   _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_Chunk>,_std::allocator<std::pair<const_unsigned_long,_Chunk>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   ::find(p_Var12,(key_type *)__first);
          if (cVar13.super__Node_iterator_base<std::pair<const_unsigned_long,_Chunk>,_false>._M_cur
              == (__node_type *)0x0) goto LAB_0016e96f;
          Chunk::markAsSaved((Chunk *)((long)cVar13.
                                             super__Node_iterator_base<std::pair<const_unsigned_long,_Chunk>,_false>
                                             ._M_cur + 0x10));
        }
      }
      p_Var17 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var17);
    } while (p_Var17 != (_Rb_tree_node_base *)(local_1468 + 8));
  }
  writeRegionHeader((ChunkHeader *)local_1038,(path *)__first,(ostream *)local_1238);
  std::fstream::close();
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::vector<char,_std::allocator<char>_>_>_>_>
               *)local_1468);
  local_1248._0_8_ =
       std::fstream-in-ghc::filesystem::basic_fstream<char,std::char_traits<char>>::
       construction_vtable + 0x18;
  local_1140[0] = 0x27af68;
  local_1238._0_8_ = 0x27af40;
  std::filebuf::~filebuf((filebuf *)(local_1238 + 8));
  local_1248._0_8_ =
       std::istream-in-ghc::filesystem::basic_fstream<char,std::char_traits<char>>::
       construction_vtable + 0x18;
  local_1140[0] = 0x27b030;
  local_1248._8_8_ = 0;
  std::ios_base::~ios_base((ios_base *)local_1140);
  ghc::filesystem::path::~path(&local_13c8);
  return;
LAB_0016e96f:
  std::__throw_out_of_range(anon_var_dwarf_2b4f2);
  goto LAB_0016e97b;
}

Assistant:

void RegionFileFormat::saveRegion(Board& board, const RegionCoords& regionCoords, const Region& region) {
    fs::path regionFilename = std::to_string(regionCoords.first) + "." + std::to_string(regionCoords.second) + ".dat";
    regionFilename = getFilename() / "region" / regionFilename;
    fs::fstream regionFile(regionFilename, std::ios::in | std::ios::out | std::ios::binary);
    spdlog::debug("Saving chunks for region {}, {}.", regionCoords.first, regionCoords.second);

    ChunkHeader header[REGION_WIDTH * REGION_WIDTH] = {};
    std::streamsize regionFileLength = 0;
    if (regionFile.is_open()) {
        // Determine number of bytes we can read from the file, should match the file size in most cases.
        // https://stackoverflow.com/questions/22984956/tellg-function-give-wrong-size-of-file/22986486#22986486
        regionFile.ignore(std::numeric_limits<std::streamsize>::max());
        regionFileLength = regionFile.gcount();
        regionFile.clear();
        regionFile.seekg(0, std::ios::beg);
        if (regionFileLength < 4 * REGION_WIDTH * REGION_WIDTH) {
            throw std::runtime_error(
                "\"" + regionFilename.string() + "\": binary file with " + std::to_string(regionFileLength) +
                " bytes is less than minimum size of " + std::to_string(4 * REGION_WIDTH * REGION_WIDTH) + " bytes."
            );
        }
        if (regionFileLength % SECTOR_SIZE != 0) {
            throw std::runtime_error(
                "\"" + regionFilename.string() + "\": binary file with " + std::to_string(regionFileLength) +
                " bytes is not evenly divisible by " + std::to_string(SECTOR_SIZE) + " byte sectors."
            );
        }

        spdlog::debug("Found existing region file with {} bytes.", regionFileLength);
        readRegionHeader(header, regionFilename, regionFile);
    } else {
        regionFile.open(regionFilename, std::ios::out | std::ios::binary);
        if (!regionFile.is_open()) {
            throw std::runtime_error("\"" + regionFilename.string() + "\": unable to open file for writing.");
        }
    }
    regionFile.seekp(0, std::ios::beg);

    bool reallocationRequired = false;
    std::map<ChunkCoords::repr, std::vector<char>> serializedChunks;
    for (const auto& chunkCoords : region) {
        const auto serialized = serializedChunks.emplace(chunkCoords, board.getLoadedChunks().at(chunkCoords).serialize()).first;
        if (regionFileLength > 0) {
            const auto regionOffset = toRegionOffset(chunkCoords);
            const int headerIndex = regionOffset.first + regionOffset.second * REGION_WIDTH;
            const uint32_t serializedSize = static_cast<uint32_t>(serialized->second.size() + sizeof(serializedSize));
            const uint32_t sectorCount = (serializedSize + SECTOR_SIZE - 1) / SECTOR_SIZE;
            if (header[headerIndex].sectors > 0) {
                if (serialized->second.empty()) {
                    spdlog::debug("Chunk {} requires 0 sectors, removing.", ChunkCoords::toPair(chunkCoords));
                    reallocationRequired = true;
                } else if (header[headerIndex].sectors < sectorCount) {
                    const uint32_t currentSectors = header[headerIndex].sectors;
                    spdlog::debug("Chunk {} requires {} sectors but only {} are allocated.", ChunkCoords::toPair(chunkCoords), sectorCount, currentSectors);
                    reallocationRequired = true;
                }
            }
        }
    }

    const char emptySector[SECTOR_SIZE] = {};
    uint32_t lastOffset = 4 * REGION_WIDTH * REGION_WIDTH / SECTOR_SIZE;
    if (reallocationRequired) {
        // Read in all chunks and wipe header.
        spdlog::debug("Preparing all chunks for reallocation.");
        for (int i = 0; i < REGION_WIDTH * REGION_WIDTH; ++i) {
            const auto chunkCoords = ChunkCoords::pack(i % REGION_WIDTH + regionCoords.first * REGION_WIDTH, i / REGION_WIDTH + regionCoords.second * REGION_WIDTH);
            if (header[i].sectors > 0 && serializedChunks.count(chunkCoords) == 0) {
                serializedChunks.emplace(
                    chunkCoords,
                    readChunk(header, i, regionFilename, regionFile)
                );
            }
            header[i].offset = 0;
            header[i].sectors = 0;
        }
    } else if (regionFileLength == 0) {
        // Write empty header.
        for (uint32_t i = 0; i < lastOffset; ++i) {
            regionFile.write(emptySector, SECTOR_SIZE);
        }
    } else {
        lastOffset = static_cast<uint32_t>(regionFileLength / SECTOR_SIZE);
    }

    // Write chunks.
    for (const auto& serialized : serializedChunks) {
        const auto regionOffset = toRegionOffset(serialized.first);
        const int headerIndex = regionOffset.first + regionOffset.second * REGION_WIDTH;
        const uint32_t serializedSize = static_cast<uint32_t>(serialized.second.size() + sizeof(serializedSize));
        if (serialized.second.empty()) {
            savedRegions_[regionCoords].erase(serialized.first);
            continue;
        } else if (serializedSize <= std::numeric_limits<uint8_t>::max() * static_cast<uint32_t>(SECTOR_SIZE)) {
            savedRegions_[regionCoords].insert(serialized.first);
        } else {
            // FIXME unable to save this chunk, too much data
            // FIXME this check should be moved into writeChunk().
            spdlog::error("Failed to save chunk at {} (serialized to {} bytes).", ChunkCoords::toPair(serialized.first), serialized.second.size());
            continue;
        }

        spdlog::debug("Writing chunk {}.", ChunkCoords::toPair(serialized.first));
        board.getLoadedChunks().at(serialized.first).debugPrintChunk();
        writeChunk(header, headerIndex, emptySector, lastOffset, serialized.second, regionFilename, regionFile);
        board.getLoadedChunks().at(serialized.first).markAsSaved();
    }

    // Write (filled) header.
    writeRegionHeader(header, regionFilename, regionFile);

    // FIXME make a check if the regionFileLength is greater than length from lastOffset to determine if we need to
    // truncate the file with fs::resize_file

    regionFile.close();

    // FIXME need to clean up empty chunks (or should we do this after all regions have been saved?).


}